

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O3

void Bmc_EcoMiterTest(void)

{
  int iVar1;
  FILE *pFVar2;
  Gia_Man_t *pGold;
  Gia_Man_t *pGVar3;
  Vec_Int_t *p;
  int *piVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  Vec_Int_t *pVVar8;
  
  pFVar2 = fopen("eco_gold.aig","r");
  if (pFVar2 == (FILE *)0x0) {
    pcVar6 = "eco_gold.aig";
  }
  else {
    fclose(pFVar2);
    pFVar2 = fopen("eco_old.aig","r");
    if (pFVar2 != (FILE *)0x0) {
      fclose(pFVar2);
      piVar4 = (int *)0x0;
      pGold = Gia_AigerRead("eco_gold.aig",0,0,0);
      pGVar3 = Gia_AigerRead("eco_old.aig",0,0,0);
      pVVar8 = pGVar3->vCis;
      iVar1 = pVVar8->nSize;
      p = (Vec_Int_t *)malloc(0x10);
      iVar5 = 0x10;
      if (0xe < iVar1 - 1U) {
        iVar5 = iVar1;
      }
      p->nSize = 0;
      p->nCap = iVar5;
      if (iVar5 != 0) {
        piVar4 = (int *)malloc((long)iVar5 << 2);
      }
      p->pArray = piVar4;
      if (0 < iVar1) {
        lVar7 = 0;
        do {
          iVar1 = pVVar8->pArray[lVar7];
          if ((iVar1 < 0) || (pGVar3->nObjs <= iVar1)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
          Vec_IntPush(p,iVar1);
          lVar7 = lVar7 + 1;
          pVVar8 = pGVar3->vCis;
        } while (lVar7 < pVVar8->nSize);
      }
      pGVar3 = Bmc_EcoMiter(pGold,pGVar3,p);
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
      }
      free(p);
      Gia_AigerWrite(pGVar3,"eco_miter.aig",0,0);
      iVar1 = Bmc_EcoPatch(pGVar3,pGold->vCis->nSize,pGold->vCos->nSize);
      puts(&DAT_00949218 + *(int *)(&DAT_0094921c + (long)iVar1 * 4));
      Gia_ManStop(pGVar3);
      return;
    }
    pcVar6 = "eco_old.aig";
  }
  printf("File \"%s\" does not exist.\n",pcVar6);
  return;
}

Assistant:

void Bmc_EcoMiterTest()
{
    char * pFileGold = "eco_gold.aig";
    char * pFileOld =  "eco_old.aig";
    Vec_Int_t * vFans;
    FILE * pFile;
    Gia_Man_t * pMiter;
    Gia_Obj_t * pObj;
    Gia_Man_t * pGold;
    Gia_Man_t * pOld;
    int i, RetValue;
    // check that the files exist
    pFile = fopen( pFileGold, "r" );
    if ( pFile == NULL )
    {
        printf( "File \"%s\" does not exist.\n", pFileGold );
        return;
    }
    fclose( pFile );
    pFile = fopen( pFileOld, "r" );
    if ( pFile == NULL )
    {
        printf( "File \"%s\" does not exist.\n", pFileOld );
        return;
    }
    fclose( pFile );
    // read files
    pGold = Gia_AigerRead( pFileGold, 0, 0, 0 );
    pOld  = Gia_AigerRead( pFileOld, 0, 0, 0 );
    // create ECO miter
    vFans = Vec_IntAlloc( Gia_ManCiNum(pOld) );
    Gia_ManForEachCi( pOld, pObj, i )
        Vec_IntPush( vFans, Gia_ObjId(pOld, pObj) );
    pMiter = Bmc_EcoMiter( pGold, pOld, vFans );
    Vec_IntFree( vFans );
    Gia_AigerWrite( pMiter, "eco_miter.aig", 0, 0 );
    // find the patch
    RetValue = Bmc_EcoPatch( pMiter, Gia_ManCiNum(pGold), Gia_ManCoNum(pGold) );
    if ( RetValue == 1 )
        printf( "Patch is computed.\n" );
    if ( RetValue == 0 )
        printf( "Cannot be patched.\n" );
    if ( RetValue == -1 )
        printf( "Resource limit exceeded.\n" );
    Gia_ManStop( pMiter );
}